

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_complex_sin(sexp ctx,sexp z)

{
  sexp psVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  sexp res;
  sexp_gc_var_t local_28;
  
  dVar2 = sexp_to_double(ctx,(z->value).type.name);
  dVar3 = sexp_to_double(ctx,(z->value).type.cpl);
  local_28.var = &res;
  res = (sexp)&DAT_0000043e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  res = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
  dVar4 = sin(dVar2);
  dVar5 = cosh(dVar3);
  psVar1 = sexp_make_flonum(ctx,dVar5 * dVar4);
  (res->value).type.name = psVar1;
  dVar2 = cos(dVar2);
  dVar3 = sinh(dVar3);
  psVar1 = sexp_make_flonum(ctx,dVar3 * dVar2);
  (res->value).type.cpl = psVar1;
  (ctx->value).context.saves = local_28.next;
  return res;
}

Assistant:

sexp sexp_complex_sin (sexp ctx, sexp z) {
  double x = sexp_to_double(ctx, sexp_complex_real(z)),
    y = sexp_to_double(ctx, sexp_complex_imag(z));
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(res) = sexp_make_flonum(ctx, sin(x)*cosh(y));
  sexp_complex_imag(res) = sexp_make_flonum(ctx, cos(x)*sinh(y));
  sexp_gc_release1(ctx);
  return res;
}